

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::erase
          (QMovableArrayOps<QTextLayout::FormatRange> *this,FormatRange *b,qsizetype n)

{
  QArrayDataPointer<QTextLayout::FormatRange> *__src;
  QArrayDataPointer<QTextLayout::FormatRange> *pQVar1;
  FormatRange *pFVar2;
  long in_RDX;
  QArrayDataPointer<QTextLayout::FormatRange> *in_RSI;
  long in_RDI;
  FormatRange *e;
  FormatRange *in_stack_ffffffffffffffa8;
  QArrayDataPointer<QTextLayout::FormatRange> *in_stack_ffffffffffffffb0;
  
  __src = in_RSI + in_RDX;
  std::destroy<QTextLayout::FormatRange*>
            ((FormatRange *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar1 = (QArrayDataPointer<QTextLayout::FormatRange> *)
           QArrayDataPointer<QTextLayout::FormatRange>::begin
                     ((QArrayDataPointer<QTextLayout::FormatRange> *)0x79dc77);
  if ((in_RSI == pQVar1) &&
     (pQVar1 = (QArrayDataPointer<QTextLayout::FormatRange> *)
               QArrayDataPointer<QTextLayout::FormatRange>::end(in_stack_ffffffffffffffb0),
     __src != pQVar1)) {
    *(QArrayDataPointer<QTextLayout::FormatRange> **)(in_RDI + 8) = __src;
  }
  else {
    pQVar1 = (QArrayDataPointer<QTextLayout::FormatRange> *)
             QArrayDataPointer<QTextLayout::FormatRange>::end(in_stack_ffffffffffffffb0);
    if (__src != pQVar1) {
      pFVar2 = QArrayDataPointer<QTextLayout::FormatRange>::end(in_RSI);
      memmove(in_RSI,__src,(((long)pFVar2 - (long)__src) / 0x18) * 0x18);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }